

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::getReducedRow
          (Highs *this,HighsInt row,double *row_vector,HighsInt *row_num_nz,HighsInt *row_indices,
          double *pass_basis_inverse_row_vector)

{
  uint uVar1;
  int iVar2;
  pointer piVar3;
  HighsStatus HVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  vector<double,_std::allocator<double>_> basis_inverse_row;
  value_type_conflict1 local_90;
  vector<double,_std::allocator<double>_> rhs;
  vector<int,_std::allocator<int>_> col_indices;
  string local_50;
  
  HighsSparseMatrix::ensureColwise(&(this->model_).lp_.a_matrix_);
  if (row_vector == (double *)0x0) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "getReducedRow: row_vector is NULL\n");
  }
  else {
    uVar1 = (this->model_).lp_.num_row_;
    if (-1 < row && row < (int)uVar1) {
      if ((this->ekk_instance_).status_.has_invert != false) {
        basis_inverse_row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        basis_inverse_row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        basis_inverse_row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pass_basis_inverse_row_vector == (double *)0x0) {
          rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          col_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          col_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          col_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          local_90 = 0.0;
          std::vector<double,_std::allocator<double>_>::_M_fill_assign(&rhs,(ulong)uVar1,&local_90);
          rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[(uint)row] = 1.0;
          local_90 = 0.0;
          std::vector<double,_std::allocator<double>_>::resize
                    (&basis_inverse_row,(ulong)uVar1,&local_90);
          basisSolveInterface(this,&rhs,
                              basis_inverse_row.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start,(HighsInt *)0x0,
                              (HighsInt *)0x0,true);
          pass_basis_inverse_row_vector =
               basis_inverse_row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&col_indices.super__Vector_base<int,_std::allocator<int>_>);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&rhs.super__Vector_base<double,_std::allocator<double>_>);
        }
        if (row_num_nz != (HighsInt *)0x0) {
          *row_num_nz = 0;
        }
        piVar3 = (this->model_).lp_.a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar6 = 0;
        while (lVar5 = lVar6, lVar5 < (this->model_).lp_.num_col_) {
          dVar7 = 0.0;
          for (lVar6 = (long)piVar3[lVar5]; lVar6 < piVar3[lVar5 + 1]; lVar6 = lVar6 + 1) {
            dVar7 = dVar7 + (this->model_).lp_.a_matrix_.value_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar6] *
                            pass_basis_inverse_row_vector
                            [(this->model_).lp_.a_matrix_.index_.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar6]];
          }
          row_vector[lVar5] = 0.0;
          lVar6 = lVar5 + 1;
          if (1e-14 < ABS(dVar7)) {
            if (row_num_nz != (HighsInt *)0x0) {
              iVar2 = *row_num_nz;
              *row_num_nz = iVar2 + 1;
              row_indices[iVar2] = (HighsInt)lVar5;
            }
            row_vector[lVar5] = dVar7;
          }
        }
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&basis_inverse_row.super__Vector_base<double,_std::allocator<double>_>);
        return kOk;
      }
      std::__cxx11::string::string
                ((string *)&local_50,"getReducedRow",(allocator *)&basis_inverse_row);
      HVar4 = invertRequirementError(this,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      return HVar4;
    }
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "Row index %d out of range [0, %d] in getReducedRow\n",(ulong)(uint)row,
                 (ulong)(uVar1 - 1));
  }
  return kError;
}

Assistant:

HighsStatus Highs::getReducedRow(const HighsInt row, double* row_vector,
                                 HighsInt* row_num_nz, HighsInt* row_indices,
                                 const double* pass_basis_inverse_row_vector) {
  HighsLp& lp = model_.lp_;
  // Ensure that the LP is column-wise
  lp.ensureColwise();
  if (row_vector == NULL) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "getReducedRow: row_vector is NULL\n");
    return HighsStatus::kError;
  }
  // row_indices can be NULL - it's the trigger that determines
  // whether they are identified or not pass_basis_inverse_row_vector
  // NULL - it's the trigger to determine whether it's computed or not
  if (row < 0 || row >= lp.num_row_) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Row index %" HIGHSINT_FORMAT
                 " out of range [0, %" HIGHSINT_FORMAT "] in getReducedRow\n",
                 row, lp.num_row_ - 1);
    return HighsStatus::kError;
  }
  if (!ekk_instance_.status_.has_invert)
    return invertRequirementError("getReducedRow");
  HighsInt num_row = lp.num_row_;
  vector<double> basis_inverse_row;
  double* basis_inverse_row_vector = (double*)pass_basis_inverse_row_vector;
  if (basis_inverse_row_vector == NULL) {
    vector<double> rhs;
    vector<HighsInt> col_indices;
    rhs.assign(num_row, 0);
    rhs[row] = 1;
    basis_inverse_row.resize(num_row, 0);
    // Form B^{-T}e_{row}
    basisSolveInterface(rhs, basis_inverse_row.data(), NULL, NULL, true);
    basis_inverse_row_vector = basis_inverse_row.data();
  }
  bool return_indices = row_num_nz != NULL;
  if (return_indices) *row_num_nz = 0;
  for (HighsInt col = 0; col < lp.num_col_; col++) {
    double value = 0;
    for (HighsInt el = lp.a_matrix_.start_[col];
         el < lp.a_matrix_.start_[col + 1]; el++) {
      HighsInt row = lp.a_matrix_.index_[el];
      value += lp.a_matrix_.value_[el] * basis_inverse_row_vector[row];
    }
    row_vector[col] = 0;
    if (fabs(value) > kHighsTiny) {
      if (return_indices) row_indices[(*row_num_nz)++] = col;
      row_vector[col] = value;
    }
  }
  return HighsStatus::kOk;
}